

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionValueNE_Test *this)

{
  undefined4 *puVar1;
  int x;
  AssertionResult iutest_ar;
  AssertionResult ar;
  
  iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  iutest_ar.m_result = true;
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 2;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

IUTEST(SyntaxTest, GT)
{
    if( int x = 1 )
        IUTEST_ASSERT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_GT(2, x) << x;
}